

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<TPZManVector<double,_10>,_20> * __thiscall
TPZManVector<TPZManVector<double,_10>,_20>::operator=
          (TPZManVector<TPZManVector<double,_10>,_20> *this,
          TPZManVector<TPZManVector<double,_10>,_20> *rval)

{
  ulong uVar1;
  double dVar2;
  TPZManVector<double,_10> *pTVar3;
  TPZManVector<double,_10> *this_00;
  ulong uVar4;
  long lVar5;
  TPZManVector<double,_10> *pTVar6;
  TPZManVector<double,_10> local_a0;
  
  if (this == rval) goto LAB_010cde77;
  uVar1 = (rval->super_TPZVec<TPZManVector<double,_10>_>).fNElements;
  pTVar6 = (this->super_TPZVec<TPZManVector<double,_10>_>).fStore;
  pTVar3 = this->fExtAlloc;
  if (pTVar6 != pTVar3 && pTVar6 != (TPZManVector<double,_10> *)0x0) {
    dVar2 = pTVar6[-1].fExtAlloc[9];
    if (dVar2 != 0.0) {
      lVar5 = (long)dVar2 * 0x70;
      do {
        TPZManVector<double,_10>::~TPZManVector
                  ((TPZManVector<double,_10> *)((long)pTVar6[-1].fExtAlloc + lVar5 + -0x20));
        lVar5 = lVar5 + -0x70;
      } while (lVar5 != 0);
    }
    operator_delete__(pTVar6[-1].fExtAlloc + 9,(long)dVar2 * 0x70 | 8);
    (this->super_TPZVec<TPZManVector<double,_10>_>).fStore = (TPZManVector<double,_10> *)0x0;
    (this->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
  }
  if ((long)uVar1 < 0x15) {
    if ((long)uVar1 < 1) {
      uVar4 = 0;
    }
    else {
      pTVar6 = rval->fExtAlloc;
      this_00 = pTVar3;
      uVar4 = uVar1;
      do {
        TPZManVector<double,_10>::operator=(this_00,pTVar6);
        this_00 = this_00 + 1;
        pTVar6 = pTVar6 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      uVar4 = uVar1;
      if (0x13 < uVar1) {
        uVar4 = 0;
        goto LAB_010cde6b;
      }
    }
    pTVar6 = this->fExtAlloc + uVar4;
    do {
      uVar4 = uVar4 + 1;
      TPZManVector<double,_10>::TPZManVector(&local_a0,0);
      TPZManVector<double,_10>::operator=(pTVar6,&local_a0);
      TPZManVector<double,_10>::~TPZManVector(&local_a0);
      pTVar6 = pTVar6 + 1;
    } while ((int)uVar4 != 0x14);
    uVar4 = 0;
  }
  else {
    pTVar3 = (rval->super_TPZVec<TPZManVector<double,_10>_>).fStore;
    uVar4 = uVar1;
  }
LAB_010cde6b:
  (this->super_TPZVec<TPZManVector<double,_10>_>).fStore = pTVar3;
  (this->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = uVar4;
  (this->super_TPZVec<TPZManVector<double,_10>_>).fNElements = uVar1;
LAB_010cde77:
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fStore = (TPZManVector<double,_10> *)0x0;
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fNElements = 0;
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}